

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_function_primitive_adoptDefinitionOf
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_context_t *context_00;
  size_t sVar1;
  _Bool _Var2;
  uint uVar3;
  sysbvm_bitflags_t sVar4;
  sysbvm_chunkedAllocatorChunk_t *psVar5;
  sysbvm_tuple_t sVar6;
  ulong uVar7;
  sysbvm_tuple_t *psVar8;
  sysbvm_context_t *context_01;
  long lStack_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
    closure = argumentCount;
  }
  _Var2 = sysbvm_tuple_isFunction((sysbvm_context_t *)*arguments,closure);
  if (!_Var2) {
    sysbvm_error("Expected a function.");
  }
  context_01 = (sysbvm_context_t *)arguments[1];
  _Var2 = sysbvm_tuple_isFunction(context_01,closure);
  if (!_Var2) {
    sysbvm_error("Expected a function.");
    context_01 = (sysbvm_context_t *)arguments[1];
  }
  sVar6 = *arguments;
  *(sysbvm_chunkedAllocatorChunk_t **)(sVar6 + 0x48) =
       (context_01->heap).gcRootTableAllocator.lastChunk;
  psVar5 = (context_01->heap).gcRootTableAllocator.firstChunk;
  *(undefined8 *)(sVar6 + 0x38) = *(undefined8 *)&(context_01->heap).gcBlackColor;
  *(sysbvm_chunkedAllocatorChunk_t **)(sVar6 + 0x40) = psVar5;
  context_00 = (sysbvm_context_t *)*arguments;
  sVar4 = sysbvm_function_getFlags(context_00,closure);
  if ((sVar4 & 4) == 0) {
    (context_00->heap).nextGCSizeThreshold = (context_01->heap).nextGCSizeThreshold;
    sVar1 = (context_01->heap).gcRootTableAllocator.chunkSize;
    (context_00->heap).gcRootTableAllocator.currentChunk =
         (context_01->heap).gcRootTableAllocator.currentChunk;
    (context_00->heap).gcRootTableAllocator.chunkSize = sVar1;
    psVar5 = (context_01->heap).picTableAllocator.firstChunk;
    lStack_30 = 0x68;
  }
  else {
    uVar7 = (context_00->heap).nextGCSizeThreshold;
    if (uVar7 == 0 || (uVar7 & 0xf) != 0) {
      uVar3 = (uint)((long)uVar7 >> 4);
    }
    else {
      uVar3 = (uint)*(undefined8 *)(uVar7 + 0x10);
    }
    uVar7 = (context_01->heap).nextGCSizeThreshold;
    if (uVar7 == 0 || (uVar7 & 0xf) != 0) {
      uVar7 = (long)uVar7 >> 4;
    }
    else {
      uVar7 = *(ulong *)(uVar7 + 0x10);
    }
    (context_00->heap).nextGCSizeThreshold = (uVar7 | uVar3 & 0x8001c) << 4 | 0xb;
    psVar5 = (sysbvm_chunkedAllocatorChunk_t *)(context_01->heap).gcRootTableAllocator.chunkSize;
    if (psVar5 == (sysbvm_chunkedAllocatorChunk_t *)0x0) goto LAB_00111418;
    lStack_30 = 0x58;
  }
  *(sysbvm_chunkedAllocatorChunk_t **)((long)&(context_00->heap).firstMallocObject + lStack_30) =
       psVar5;
LAB_00111418:
  psVar8 = (sysbvm_tuple_t *)*arguments;
  if (psVar8[3] != 0 || psVar8[2] != 0) {
    sysbvm_programEntity_recordBindingWithOwnerAndName(context,psVar8[9],psVar8[3],psVar8[2]);
    psVar8 = (sysbvm_tuple_t *)*arguments;
    context_01 = (sysbvm_context_t *)arguments[1];
  }
  sVar6 = sysbvm_tuple_getType(context,(sysbvm_tuple_t)context_01);
  *psVar8 = sVar6;
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_adoptDefinitionOf(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    sysbvm_tuple_t *definitionFunction = &arguments[1];
    if(!sysbvm_tuple_isFunction(context, *function)) sysbvm_error("Expected a function.");
    if(!sysbvm_tuple_isFunction(context, *definitionFunction)) sysbvm_error("Expected a function.");
    
    sysbvm_function_t **functionObject = (sysbvm_function_t**)function;
    sysbvm_function_t **definitionFunctionObject = (sysbvm_function_t**)definitionFunction;

    (*functionObject)->definition = (*definitionFunctionObject)->definition;
    (*functionObject)->captureVector = (*definitionFunctionObject)->captureVector;
    (*functionObject)->captureEnvironment = (*definitionFunctionObject)->captureEnvironment;
    bool isCorePrimitive = sysbvm_function_isCorePrimitive(context, *function);
    if(isCorePrimitive)
    {
        (*functionObject)->flags = sysbvm_tuple_bitflags_encode(
            (sysbvm_tuple_bitflags_decode((*functionObject)->flags) & SYSBVM_FUNCTION_FLAGS_BOOTSTRAP_PRIMITIVE_KEPT_FLAGS)
            | sysbvm_tuple_bitflags_decode((*definitionFunctionObject)->flags)
        );

        if((*definitionFunctionObject)->primitiveName)
            (*functionObject)->primitiveName = (*definitionFunctionObject)->primitiveName;
    }
    else
    {
        (*functionObject)->flags = (*definitionFunctionObject)->flags;
        (*functionObject)->primitiveName = (*definitionFunctionObject)->primitiveName;
        (*functionObject)->primitiveTableIndex = (*definitionFunctionObject)->primitiveTableIndex;
        (*functionObject)->annotations = (*definitionFunctionObject)->annotations;
    }

    if((*functionObject)->super.owner || (*functionObject)->super.name)
        sysbvm_programEntity_recordBindingWithOwnerAndName(context, (*functionObject)->definition, (*functionObject)->super.owner, (*functionObject)->super.name);
    sysbvm_tuple_setType((sysbvm_object_tuple_t*)*functionObject, sysbvm_tuple_getType(context, (sysbvm_tuple_t)*definitionFunctionObject));
    return SYSBVM_VOID_TUPLE;
}